

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_watershield(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RDX;
  undefined2 in_SI;
  AFFECT_DATA af;
  AFFECT_DATA *in_stack_ffffffffffffff78;
  CHAR_DATA *in_stack_ffffffffffffff80;
  CHAR_DATA *in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff92;
  undefined2 uVar2;
  undefined2 in_stack_ffffffffffffff94;
  short sVar3;
  undefined2 in_stack_ffffffffffffff96;
  
  bVar1 = is_affected(in_RDX,(int)gsn_watershield);
  if (bVar1) {
    send_to_char((char *)CONCAT26(in_stack_ffffffffffffff96,
                                  CONCAT24(in_stack_ffffffffffffff94,
                                           CONCAT22(in_stack_ffffffffffffff92,
                                                    in_stack_ffffffffffffff90))),
                 in_stack_ffffffffffffff88);
  }
  else {
    init_affect((AFFECT_DATA *)0x6da3cc);
    uVar2 = 0;
    sVar3 = gsn_watershield;
    affect_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    send_to_char((char *)CONCAT26(in_SI,CONCAT24(sVar3,CONCAT22(uVar2,in_stack_ffffffffffffff90))),
                 in_stack_ffffffffffffff88);
    act((char *)CONCAT26(in_SI,CONCAT24(sVar3,CONCAT22(uVar2,in_stack_ffffffffffffff90))),
        in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
  }
  return;
}

Assistant:

void spell_watershield(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, gsn_watershield))
	{
		send_to_char("You are already surrounded by a shield of water.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = gsn_watershield;
	af.modifier = 0;
	af.level = level;
	af.duration = level / 4;
	af.location = 0;
	af.mod_name = MOD_PROTECTION;
	affect_to_char(ch, &af);

	send_to_char("You form a shield of swirling water around you.\n\r", ch);
	act("A magical sphere of swirling water briefly surrounds $n.", ch, 0, 0, TO_ROOM);
}